

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O0

int PAL_wvsscanf(LPCWSTR Buffer,LPCWSTR Format,__va_list_tag *ap)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  FILE *pFVar5;
  int iVar6;
  BOOL BVar7;
  DWORD DVar8;
  char *lpMultiByteStr;
  size_t sVar9;
  size_t sVar10;
  long in_FS_OFFSET;
  bool bVar11;
  uint local_544;
  int local_540;
  undefined8 *local_538;
  long *local_520;
  undefined8 *local_4f8;
  undefined8 *local_4d8;
  long *local_4b8;
  uint local_4a0;
  int local_49c;
  uint typeLen;
  int i_1;
  WCHAR *strPtr;
  LPVOID voidPtr;
  LPSTR newBuff;
  int size;
  int n;
  int ret;
  int i;
  WCHAR *charPtr;
  int local_460;
  int len;
  INT Type;
  INT Prefix;
  INT Width;
  BOOL Store;
  LPCWSTR Fmt;
  LPCWSTR Buff;
  __va_list_tag *p_Stack_438;
  INT Length;
  __va_list_tag *ap_local;
  LPCWSTR Format_local;
  LPCWSTR Buffer_local;
  CHAR local_418 [8];
  CHAR TempBuff [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  Buff._4_4_ = 0;
  local_460 = -1;
  _Width = Format;
  Fmt = Buffer;
  p_Stack_438 = ap;
  ap_local = (__va_list_tag *)Format;
  Format_local = Buffer;
  do {
    if (*_Width == L'\0') {
LAB_0037446b:
      Buffer_local._4_4_ = Buff._4_4_;
LAB_00374477:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return Buffer_local._4_4_;
    }
    if ((*Fmt == L'\0') && (Buff._4_4_ == 0)) {
      Buff._4_4_ = -1;
      goto LAB_0037446b;
    }
    iVar6 = isspace((uint)(ushort)*_Width);
    if (iVar6 == 0) {
      if ((*_Width == L'%') &&
         (BVar7 = Internal_ScanfExtractFormatW
                            ((LPCWSTR *)&Width,local_418,0x400,&Prefix,&Type,&len,&local_460),
         BVar7 != 0)) {
        if ((len == 2) && ((local_460 == 2 || (local_460 == 1)))) {
          charPtr._4_4_ = 0;
          _ret = 0;
          if ((local_460 == 1) && (Type == -1)) {
            Type = 1;
            charPtr._4_4_ = 1;
          }
          while( true ) {
            bVar11 = false;
            if (Fmt[charPtr._4_4_] != L'\0') {
              iVar6 = isspace((uint)(ushort)Fmt[charPtr._4_4_]);
              bVar11 = iVar6 == 0;
            }
            if ((!bVar11) || ((Type != -1 && (Type <= charPtr._4_4_)))) break;
            charPtr._4_4_ = charPtr._4_4_ + 1;
          }
          if (Prefix != 0) {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_4b8 = (long *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_4b8 = (long *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_4b8 + 1;
            }
            _ret = *local_4b8;
            for (n = 0; n < charPtr._4_4_; n = n + 1) {
              *(WCHAR *)(_ret + (long)n * 2) = Fmt[n];
            }
            if (local_460 == 2) {
              *(undefined2 *)(_ret + (long)charPtr._4_4_ * 2) = 0;
            }
            Buff._4_4_ = Buff._4_4_ + 1;
          }
          Fmt = Fmt + charPtr._4_4_;
        }
        else if (local_460 == 4) {
          if (len == 1) {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_4d8 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_4d8 = (undefined8 *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_4d8 + 1;
            }
            *(short *)*local_4d8 = (short)((long)Fmt - (long)Format_local >> 1);
          }
          else {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_4f8 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_4f8 = (undefined8 *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_4f8 + 1;
            }
            *(int *)*local_4f8 = (int)((long)Fmt - (long)Format_local >> 1);
          }
        }
        else {
          newBuff._0_4_ = WideCharToMultiByte(0,0,Fmt,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
          if ((int)newBuff == 0) {
            fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                    ,0x554);
            pFVar5 = _stderr;
            DVar8 = GetLastError();
            fprintf(pFVar5,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar8);
            Buffer_local._4_4_ = -1;
            goto LAB_00374477;
          }
          lpMultiByteStr = (char *)PAL_malloc((long)(int)newBuff);
          if (lpMultiByteStr == (char *)0x0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            SetLastError(8);
            Buffer_local._4_4_ = -1;
            goto LAB_00374477;
          }
          newBuff._0_4_ =
               WideCharToMultiByte(0,0,Fmt,(int)newBuff,lpMultiByteStr,(int)newBuff,(LPCSTR)0x0,
                                   (LPBOOL)0x0);
          if ((int)newBuff == 0) {
            fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                    ,0x563);
            pFVar5 = _stderr;
            DVar8 = GetLastError();
            fprintf(pFVar5,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar8);
            PAL_free(lpMultiByteStr);
            Buffer_local._4_4_ = -1;
            goto LAB_00374477;
          }
          if (Prefix == 0) {
            size = sscanf_s(lpMultiByteStr,local_418,(long)&newBuff + 4);
          }
          else if (local_460 == 6) {
            sVar9 = strlen(local_418);
            for (local_49c = (int)sVar9 + 1; local_49c != 0; local_49c = local_49c + -1) {
              local_418[local_49c] = local_418[local_49c + -1];
            }
            local_418[0] = '%';
            local_418[1] = 0x2a;
            newBuff._4_4_ = 0;
            sscanf_s(lpMultiByteStr,local_418,(long)&newBuff + 4);
            if (newBuff._4_4_ == 0) {
              size = 0;
            }
            else {
              uVar1 = p_Stack_438->gp_offset;
              if (uVar1 < 0x29) {
                local_520 = (long *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
                p_Stack_438->gp_offset = uVar1 + 8;
              }
              else {
                local_520 = (long *)p_Stack_438->overflow_arg_area;
                p_Stack_438->overflow_arg_area = local_520 + 1;
              }
              lVar3 = *local_520;
              for (local_49c = 0; local_49c < newBuff._4_4_; local_49c = local_49c + 1) {
                *(WCHAR *)(lVar3 + (long)local_49c * 2) = Fmt[local_49c];
              }
              *(undefined2 *)(lVar3 + (long)newBuff._4_4_ * 2) = 0;
              size = 1;
            }
          }
          else {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_538 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_538 = (undefined8 *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_538 + 1;
            }
            uVar4 = *local_538;
            local_4a0 = 0;
            if (local_460 == 2) {
              if (Type < 1) {
                sVar10 = PAL_wcslen(Format_local);
                local_540 = (int)sVar10;
              }
              else {
                local_540 = Type;
              }
              local_4a0 = local_540 + 1;
            }
            else if (local_460 == 1) {
              if (Type < 1) {
                local_544 = 1;
              }
              else {
                local_544 = Type;
              }
              local_4a0 = local_544;
            }
            if (local_4a0 == 0) {
              size = sscanf_s(lpMultiByteStr,local_418,uVar4,(long)&newBuff + 4);
            }
            else {
              size = sscanf_s(lpMultiByteStr,local_418,uVar4,(ulong)local_4a0,(long)&newBuff + 4);
            }
          }
          PAL_free(lpMultiByteStr);
          if (size < 1) goto LAB_0037446b;
          Buff._4_4_ = size + Buff._4_4_;
          Fmt = Fmt + newBuff._4_4_;
        }
      }
      else {
        if ((*_Width != *Fmt) || (local_460 == 7)) goto LAB_0037446b;
        _Width = _Width + 1;
        Fmt = Fmt + 1;
      }
    }
    else {
      while (iVar6 = isspace((uint)(ushort)*Fmt), iVar6 != 0) {
        Fmt = Fmt + 1;
      }
      _Width = _Width + 1;
    }
  } while( true );
}

Assistant:

__attribute__((no_instrument_function))
int PAL_wvsscanf(LPCWSTR Buffer, LPCWSTR Format, va_list ap)
{
    INT Length = 0;
    LPCWSTR Buff = Buffer;
    LPCWSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace(*Fmt))
        {
            while (isspace(*Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatW(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace(Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    int i;
                    charPtr = va_arg(ap, WCHAR *);

                    for (i = 0; i < len; i++)
                    {
                        charPtr[i] = Buff[i];
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[len] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                int size;
                LPSTR newBuff = 0;
                LPVOID voidPtr = NULL;

                size = WideCharToMultiByte(CP_ACP, 0, Buff, -1, 0, 0, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    return -1;
                }
                newBuff = (LPSTR) PAL_malloc(size);
                if (!newBuff)
                {
                    ERROR("PAL_malloc failed\n");
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    return -1;
                }
                size = WideCharToMultiByte(CP_ACP, 0, Buff, size,
                                           newBuff, size, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PAL_free(newBuff);
                    return -1;
                }

                if (Store)
                {
                    if (Type == SCANF_TYPE_BRACKETS)
                    {
                        WCHAR *strPtr;
                        int i;

                        /* add a '*' to %[] --> %*[]  */
                        i = strlen(TempBuff) + 1;
                        while (i)
                        {
                            /* shift everything right one */
                            TempBuff[i] = TempBuff[i - 1];
                            --i;
                        }
                        TempBuff[0] = '%';
                        TempBuff[1] = '*';

                        /* %n doesn't count as a conversion. Since we're
                           suppressing conversion of the %[], sscanf will
                           always return 0, so we can't use the return value
                           to determine success. Set n to 0 before the call; if
                           it's still 0 afterwards, we know the call failed */
                        n = 0;
                        sscanf_s(newBuff, TempBuff, &n);
                        if(0 == n)
                        {
                            /* sscanf failed, nothing matched. set ret to 0,
                               so we know we have to break */
                            ret = 0;
                        }
                        else
                        {
                            strPtr = va_arg(ap, WCHAR *);
                            for (i = 0; i < n; i++)
                            {
                                strPtr[i] = Buff[i];
                            }
                            strPtr[n] = 0; /* end string */
                            ret = 1;
                        }
                    }
                    else
                    {
                        voidPtr = va_arg(ap, LPVOID);
                        // sscanf_s requires that if we are trying to read "%s" or "%c", then
                        // the size of the buffer must follow the buffer we are trying to read into.
                        unsigned typeLen = 0;
                        if (Type == SCANF_TYPE_STRING)
                        {
                            // We don't really know the size of the destination buffer provided by the
                            // caller. So we have to assume that the caller has allocated enough space
                            // to hold either the width specified in the format or the entire input
                            // string plus '\0'.
                            typeLen = ((Width > 0) ? Width : PAL_wcslen(Buffer)) + 1;
                        }
                        else if (Type == SCANF_TYPE_CHAR)
                        {
                            // Check whether the format string contains number of characters
                            // that should be read from the input string.
                            // Note: '\0' does not get appended in the "%c" case.
                            typeLen = (Width > 0) ? Width : 1;
                        }

                        if (typeLen > 0)
                        {
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, typeLen, &n);
                        }
                        else
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(newBuff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(newBuff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                PAL_free(newBuff);
                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match; break scan */
                    break;
                }
                Buff += n;
            }
       }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}